

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O3

void __thiscall
cubeb_passthrough_resampler_fill_short_input_Test::TestBody
          (cubeb_passthrough_resampler_fill_short_input_Test *this)

{
  long lVar1;
  char *message;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  long output_frame_count;
  long input_frame_count;
  long got;
  passthrough_resampler<float> resampler;
  float input [64];
  float output [64];
  Message local_298;
  internal local_290 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  long local_280 [2];
  AssertHelper local_270;
  long local_268;
  passthrough_resampler<float> local_260;
  undefined8 local_218 [32];
  undefined1 local_118 [264];
  int iVar5;
  int iVar7;
  
  lVar1 = 0;
  passthrough_resampler<float>::passthrough_resampler
            (&local_260,(cubeb_stream *)0x0,passthrough_resampler_fill_short_input,(void *)0x0,2,
             0xac44);
  local_280[1] = 0x10;
  local_280[0] = 0x20;
  memset(local_218,0,0x100);
  memset(local_118,0,0x100);
  uVar2 = 0x100000000;
  uVar3 = 0x300000002;
  do {
    auVar4._0_8_ = uVar3 & 0xffffffff;
    iVar5 = (int)(uVar3 >> 0x20);
    auVar4._8_4_ = iVar5;
    auVar4._12_4_ = 0;
    iVar7 = (int)(uVar2 >> 0x20);
    auVar6._0_8_ = uVar2 & 0xffffffff;
    auVar6._8_4_ = iVar7;
    auVar6._12_4_ = 0;
    *(ulong *)((long)local_218 + lVar1 * 4) =
         CONCAT44((float)((SUB168(auVar6 | _DAT_0014e160,8) - DAT_0014e160._8_8_) * 0.01),
                  (float)((SUB168(auVar6 | _DAT_0014e160,0) - (double)DAT_0014e160) * 0.01));
    *(ulong *)((long)local_218 + lVar1 * 4 + 8) =
         CONCAT44((float)((SUB168(auVar4 | _DAT_0014e160,8) - DAT_0014e160._8_8_) * 0.01),
                  (float)((SUB168(auVar4 | _DAT_0014e160,0) - (double)DAT_0014e160) * 0.01));
    lVar1 = lVar1 + 4;
    uVar2 = CONCAT44(iVar7 + 4,(int)uVar2 + 4);
    uVar3 = CONCAT44(iVar5 + 4,(int)uVar3 + 4);
  } while (lVar1 != 0x20);
  local_268 = passthrough_resampler<float>::fill(&local_260,local_218,local_280 + 1,local_118,0x20);
  testing::internal::CmpHelperEQ<long,long>
            (local_290,"got","output_frame_count",&local_268,local_280);
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message(&local_298);
    if (local_288 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_288->_M_dataplus)._M_p;
    }
    iVar5 = 0x41e;
  }
  else {
    if (local_288 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_288,local_288);
    }
    local_298.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(local_280[0] + -0x10);
    testing::internal::CmpHelperEQ<long,long>
              (local_290,"input_frame_count","output_frame_count - 16",local_280 + 1,
               (long *)&local_298);
    if (local_290[0] != (internal)0x0) goto LAB_0010db0b;
    testing::Message::Message(&local_298);
    if (local_288 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_288->_M_dataplus)._M_p;
    }
    iVar5 = 0x420;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_270,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/test/test_resampler.cpp"
             ,iVar5,message);
  testing::internal::AssertHelper::operator=(&local_270,&local_298);
  testing::internal::AssertHelper::~AssertHelper(&local_270);
  if (local_298.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_298.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
LAB_0010db0b:
  if (local_288 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_288,local_288);
  }
  local_260.super_cubeb_resampler._vptr_cubeb_resampler = (_func_int **)&PTR_fill_0016b6d0;
  if (local_260.internal_input_buffer.data_ != (float *)0x0) {
    operator_delete__(local_260.internal_input_buffer.data_);
  }
  return;
}

Assistant:

TEST(cubeb, passthrough_resampler_fill_short_input)
{
  uint32_t channels = 2;
  uint32_t sample_rate = 44100;
  passthrough_resampler<float> resampler = passthrough_resampler<float>(
      nullptr, passthrough_resampler_fill_short_input, nullptr, channels,
      sample_rate);

  long input_frame_count = 16;
  long output_frame_count = 32;
  float input[64] = {};
  float output[64] = {};
  for (uint32_t i = 0; i < input_frame_count * channels; ++i) {
    input[i] = 0.01 * i;
  }
  long got =
      resampler.fill(input, &input_frame_count, output, output_frame_count);
  ASSERT_EQ(got, output_frame_count);
  // Input frames used are less than the output frames due to glitch.
  ASSERT_EQ(input_frame_count, output_frame_count - 16);
}